

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

void __thiscall
Js::JavascriptOperators::OP_LoadUndefinedToElementScoped
          (JavascriptOperators *this,FrameDisplay *pScope,PropertyId propertyId,Var defaultInstance,
          ScriptContext *scriptContext)

{
  undefined1 uVar1;
  ushort uVar2;
  long lVar3;
  BOOL BVar4;
  void *instance;
  undefined4 in_register_00000014;
  uint index;
  PropertyId propertyId_00;
  
  lVar3 = *(long *)((long)defaultInstance + 0x3b8);
  uVar1 = *(undefined1 *)(lVar3 + 0x108);
  *(undefined1 *)(lVar3 + 0x108) = 1;
  uVar2 = *(ushort *)(this + 2);
  index = 0;
  do {
    propertyId_00 = (PropertyId)pScope;
    if (uVar2 == index) {
      BVar4 = HasOwnPropertyNoHostObject
                        ((Var)CONCAT44(in_register_00000014,propertyId),propertyId_00);
      if (BVar4 == 0) {
        OP_InitPropertyScoped
                  ((FrameDisplay *)this,propertyId_00,
                   *(Var *)(*(long *)((long)defaultInstance + 8) + 0x430),
                   (Var)CONCAT44(in_register_00000014,propertyId),scriptContext);
      }
      break;
    }
    instance = FrameDisplay::GetItem((FrameDisplay *)this,index);
    BVar4 = EnsureProperty(instance,propertyId_00);
    index = index + 1;
  } while (BVar4 == 0);
  *(undefined1 *)(lVar3 + 0x108) = uVar1;
  return;
}

Assistant:

void JavascriptOperators::OP_LoadUndefinedToElementScoped(FrameDisplay *pScope, PropertyId propertyId, Var defaultInstance, ScriptContext* scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(Op_LdElemUndefScoped, reentrancylock, scriptContext->GetThreadContext());
        int i;
        int length = pScope->GetLength();
        Var argInstance;
        for (i = 0; i < length; i++)
        {
            argInstance = pScope->GetItem(i);
            if (JavascriptOperators::EnsureProperty(argInstance, propertyId))
            {
                return;
            }
        }

        if (!JavascriptOperators::HasOwnPropertyNoHostObject(defaultInstance, propertyId))
        {
            // CONSIDER : Consider adding pre-initialization support to activation objects.
            JavascriptOperators::OP_InitPropertyScoped(pScope, propertyId, scriptContext->GetLibrary()->GetUndefined(), defaultInstance, scriptContext);
        }
        JIT_HELPER_END(Op_LdElemUndefScoped);
    }